

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::avx::FlatLinearCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  Scene *pSVar19;
  undefined4 uVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar32;
  undefined1 auVar26 [32];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  float fVar41;
  undefined1 auVar38 [32];
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar66;
  undefined1 auVar65 [32];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [32];
  undefined1 auVar75 [32];
  float in_register_000014dc;
  undefined1 auVar76 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  int local_2e4;
  Scene *local_2e0;
  Ray *local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  RayQueryContext *local_298;
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pSVar19 = context->scene;
  uVar1 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar19->geometries).items[line->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[4];
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar1 * (long)p_Var11);
  uVar5 = (line->v0).field_0.i[5];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[6];
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[7];
  lVar21 = (ulong)uVar8 * (long)p_Var11;
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar21);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar1 + 1) * (long)p_Var11);
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar15 = vunpcklps_avx(auVar24,auVar46);
  auVar13 = vunpckhps_avx(auVar24,auVar46);
  auVar80 = vunpcklps_avx(auVar36,auVar54);
  auVar14 = vunpckhps_avx(auVar36,auVar54);
  local_260 = vunpcklps_avx(auVar15,auVar80);
  local_1e0 = vunpckhps_avx(auVar15,auVar80);
  local_200 = vunpcklps_avx(auVar13,auVar14);
  local_160 = vunpckhps_avx(auVar13,auVar14);
  auVar15 = vunpcklps_avx(auVar57,auVar62);
  auVar13 = vunpckhps_avx(auVar57,auVar62);
  auVar80 = vunpcklps_avx(auVar60,auVar68);
  auVar14 = vunpckhps_avx(auVar60,auVar68);
  local_1a0 = vunpcklps_avx(auVar15,auVar80);
  local_1c0 = vunpckhps_avx(auVar15,auVar80);
  local_240 = vunpcklps_avx(auVar13,auVar14);
  local_180 = vunpckhps_avx(auVar13,auVar14);
  auVar34 = vpcmpeqd_avx(local_180._0_16_,local_180._0_16_);
  auVar35 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar34 = vpcmpeqd_avx(auVar34,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_140._16_16_ = auVar34;
  local_140._0_16_ = auVar35;
  local_210 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_220 = local_210;
  fVar45 = (pre->ray_space).vy.field_0.m128[0];
  fVar23 = (pre->ray_space).vy.field_0.m128[1];
  fVar27 = (pre->ray_space).vz.field_0.m128[0];
  fVar28 = (pre->ray_space).vz.field_0.m128[1];
  fVar66 = *(float *)((long)&(ray->org).field_0 + 4);
  auVar64._4_4_ = fVar66;
  auVar64._0_4_ = fVar66;
  auVar64._8_4_ = fVar66;
  auVar64._12_4_ = fVar66;
  auVar64._16_4_ = fVar66;
  auVar64._20_4_ = fVar66;
  auVar64._24_4_ = fVar66;
  auVar64._28_4_ = fVar66;
  uVar20 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar37._4_4_ = uVar20;
  auVar37._0_4_ = uVar20;
  auVar37._8_4_ = uVar20;
  auVar37._12_4_ = uVar20;
  auVar37._16_4_ = uVar20;
  auVar37._20_4_ = uVar20;
  auVar37._24_4_ = uVar20;
  auVar37._28_4_ = uVar20;
  auVar13 = vsubps_avx(local_1e0,auVar64);
  auVar14 = vsubps_avx(local_200,auVar37);
  fVar42 = auVar14._0_4_;
  fVar43 = auVar14._4_4_;
  fVar44 = auVar14._8_4_;
  fVar39 = auVar14._12_4_;
  fVar41 = auVar14._16_4_;
  fVar49 = auVar14._20_4_;
  fVar77 = auVar14._24_4_;
  fVar52 = auVar13._0_4_;
  fVar53 = auVar13._4_4_;
  fVar33 = auVar13._8_4_;
  fVar40 = auVar13._12_4_;
  fVar48 = auVar13._16_4_;
  fVar50 = auVar13._20_4_;
  fVar78 = auVar13._24_4_;
  fVar29 = (pre->ray_space).vy.field_0.m128[2];
  fVar30 = (pre->ray_space).vz.field_0.m128[2];
  fVar79 = auVar14._28_4_;
  fVar31 = (pre->ray_space).vx.field_0.m128[0];
  uVar20 = *(undefined4 *)&(ray->org).field_0;
  auVar63._4_4_ = uVar20;
  auVar63._0_4_ = uVar20;
  auVar63._8_4_ = uVar20;
  auVar63._12_4_ = uVar20;
  auVar63._16_4_ = uVar20;
  auVar63._20_4_ = uVar20;
  auVar63._24_4_ = uVar20;
  auVar63._28_4_ = uVar20;
  auVar14 = vsubps_avx(local_260,auVar63);
  fVar67 = auVar14._0_4_;
  fVar69 = auVar14._4_4_;
  fVar70 = auVar14._8_4_;
  fVar71 = auVar14._12_4_;
  fVar72 = auVar14._16_4_;
  fVar73 = auVar14._20_4_;
  fVar74 = auVar14._24_4_;
  auVar47._0_4_ = fVar67 * fVar31 + fVar27 * fVar42 + fVar45 * fVar52;
  auVar47._4_4_ = fVar69 * fVar31 + fVar27 * fVar43 + fVar45 * fVar53;
  auVar47._8_4_ = fVar70 * fVar31 + fVar27 * fVar44 + fVar45 * fVar33;
  auVar47._12_4_ = fVar71 * fVar31 + fVar27 * fVar39 + fVar45 * fVar40;
  auVar47._16_4_ = fVar72 * fVar31 + fVar27 * fVar41 + fVar45 * fVar48;
  auVar47._20_4_ = fVar73 * fVar31 + fVar27 * fVar49 + fVar45 * fVar50;
  auVar47._24_4_ = fVar74 * fVar31 + fVar27 * fVar77 + fVar45 * fVar78;
  auVar47._28_4_ = fVar79 + in_register_000014dc + local_1e0._28_4_;
  fVar32 = (pre->ray_space).vx.field_0.m128[1];
  auVar75._0_4_ = fVar67 * fVar32 + fVar23 * fVar52 + fVar28 * fVar42;
  auVar75._4_4_ = fVar69 * fVar32 + fVar23 * fVar53 + fVar28 * fVar43;
  auVar75._8_4_ = fVar70 * fVar32 + fVar23 * fVar33 + fVar28 * fVar44;
  auVar75._12_4_ = fVar71 * fVar32 + fVar23 * fVar40 + fVar28 * fVar39;
  auVar75._16_4_ = fVar72 * fVar32 + fVar23 * fVar48 + fVar28 * fVar41;
  auVar75._20_4_ = fVar73 * fVar32 + fVar23 * fVar50 + fVar28 * fVar49;
  auVar75._24_4_ = fVar74 * fVar32 + fVar23 * fVar78 + fVar28 * fVar77;
  auVar75._28_4_ = fVar79 + local_200._28_4_ + in_register_000014dc;
  fVar51 = (pre->ray_space).vx.field_0.m128[2];
  auVar76._0_4_ = fVar51 * fVar67 + fVar52 * fVar29 + fVar42 * fVar30;
  auVar76._4_4_ = fVar51 * fVar69 + fVar53 * fVar29 + fVar43 * fVar30;
  auVar76._8_4_ = fVar51 * fVar70 + fVar33 * fVar29 + fVar44 * fVar30;
  auVar76._12_4_ = fVar51 * fVar71 + fVar40 * fVar29 + fVar39 * fVar30;
  auVar76._16_4_ = fVar51 * fVar72 + fVar48 * fVar29 + fVar41 * fVar30;
  auVar76._20_4_ = fVar51 * fVar73 + fVar50 * fVar29 + fVar49 * fVar30;
  auVar76._24_4_ = fVar51 * fVar74 + fVar78 * fVar29 + fVar77 * fVar30;
  auVar76._28_4_ = auVar14._28_4_ + auVar13._28_4_ + fVar79;
  auVar13 = vsubps_avx(local_240,auVar37);
  fVar42 = auVar13._0_4_;
  fVar53 = auVar13._4_4_;
  fVar39 = auVar13._8_4_;
  fVar48 = auVar13._12_4_;
  fVar77 = auVar13._16_4_;
  fVar67 = auVar13._20_4_;
  fVar71 = auVar13._24_4_;
  auVar14 = vsubps_avx(local_1c0,auVar64);
  fVar52 = auVar14._0_4_;
  fVar44 = auVar14._4_4_;
  fVar40 = auVar14._8_4_;
  fVar49 = auVar14._12_4_;
  fVar78 = auVar14._16_4_;
  fVar69 = auVar14._20_4_;
  fVar72 = auVar14._24_4_;
  fVar66 = local_240._28_4_ + fVar66;
  auVar15 = vsubps_avx(local_1a0,auVar63);
  fVar43 = auVar15._0_4_;
  fVar33 = auVar15._4_4_;
  fVar41 = auVar15._8_4_;
  fVar50 = auVar15._12_4_;
  fVar79 = auVar15._16_4_;
  fVar70 = auVar15._20_4_;
  fVar73 = auVar15._24_4_;
  auVar58._0_4_ = fVar31 * fVar43 + fVar27 * fVar42 + fVar45 * fVar52;
  auVar58._4_4_ = fVar31 * fVar33 + fVar27 * fVar53 + fVar45 * fVar44;
  auVar58._8_4_ = fVar31 * fVar41 + fVar27 * fVar39 + fVar45 * fVar40;
  auVar58._12_4_ = fVar31 * fVar50 + fVar27 * fVar48 + fVar45 * fVar49;
  auVar58._16_4_ = fVar31 * fVar79 + fVar27 * fVar77 + fVar45 * fVar78;
  auVar58._20_4_ = fVar31 * fVar70 + fVar27 * fVar67 + fVar45 * fVar69;
  auVar58._24_4_ = fVar31 * fVar73 + fVar27 * fVar71 + fVar45 * fVar72;
  auVar58._28_4_ = auVar14._28_4_ + fVar66;
  auVar61._0_4_ = fVar23 * fVar52 + fVar28 * fVar42 + fVar32 * fVar43;
  auVar61._4_4_ = fVar23 * fVar44 + fVar28 * fVar53 + fVar32 * fVar33;
  auVar61._8_4_ = fVar23 * fVar40 + fVar28 * fVar39 + fVar32 * fVar41;
  auVar61._12_4_ = fVar23 * fVar49 + fVar28 * fVar48 + fVar32 * fVar50;
  auVar61._16_4_ = fVar23 * fVar78 + fVar28 * fVar77 + fVar32 * fVar79;
  auVar61._20_4_ = fVar23 * fVar69 + fVar28 * fVar67 + fVar32 * fVar70;
  auVar61._24_4_ = fVar23 * fVar72 + fVar28 * fVar71 + fVar32 * fVar73;
  auVar61._28_4_ = local_240._28_4_ + fVar27 + fVar32;
  auVar25._0_4_ = fVar51 * fVar43 + fVar29 * fVar52 + fVar30 * fVar42;
  auVar25._4_4_ = fVar51 * fVar33 + fVar29 * fVar44 + fVar30 * fVar53;
  auVar25._8_4_ = fVar51 * fVar41 + fVar29 * fVar40 + fVar30 * fVar39;
  auVar25._12_4_ = fVar51 * fVar50 + fVar29 * fVar49 + fVar30 * fVar48;
  auVar25._16_4_ = fVar51 * fVar79 + fVar29 * fVar78 + fVar30 * fVar77;
  auVar25._20_4_ = fVar51 * fVar70 + fVar29 * fVar69 + fVar30 * fVar67;
  auVar25._24_4_ = fVar51 * fVar73 + fVar29 * fVar72 + fVar30 * fVar71;
  auVar25._28_4_ = fVar32 + fVar29 + auVar13._28_4_;
  auVar14 = vsubps_avx(auVar58,auVar47);
  auVar13 = vsubps_avx(auVar61,auVar75);
  fVar45 = auVar13._0_4_;
  fVar27 = auVar13._4_4_;
  fVar29 = auVar13._8_4_;
  fVar31 = auVar13._12_4_;
  fVar51 = auVar13._16_4_;
  fVar52 = auVar13._20_4_;
  fVar53 = auVar13._24_4_;
  fVar23 = auVar14._0_4_;
  fVar28 = auVar14._4_4_;
  fVar30 = auVar14._8_4_;
  fVar32 = auVar14._12_4_;
  fVar42 = auVar14._16_4_;
  fVar43 = auVar14._20_4_;
  fVar44 = auVar14._24_4_;
  auVar59._0_4_ = fVar23 * fVar23 + fVar45 * fVar45;
  auVar59._4_4_ = fVar28 * fVar28 + fVar27 * fVar27;
  auVar59._8_4_ = fVar30 * fVar30 + fVar29 * fVar29;
  auVar59._12_4_ = fVar32 * fVar32 + fVar31 * fVar31;
  auVar59._16_4_ = fVar42 * fVar42 + fVar51 * fVar51;
  auVar59._20_4_ = fVar43 * fVar43 + fVar52 * fVar52;
  auVar59._24_4_ = fVar44 * fVar44 + fVar53 * fVar53;
  auVar59._28_4_ = auVar61._28_4_ + auVar58._28_4_;
  auVar15._4_4_ = fVar27 * -auVar75._4_4_;
  auVar15._0_4_ = fVar45 * -auVar75._0_4_;
  auVar15._8_4_ = fVar29 * -auVar75._8_4_;
  auVar15._12_4_ = fVar31 * -auVar75._12_4_;
  auVar15._16_4_ = fVar51 * -auVar75._16_4_;
  auVar15._20_4_ = fVar52 * -auVar75._20_4_;
  auVar15._24_4_ = fVar53 * -auVar75._24_4_;
  auVar15._28_4_ = -auVar75._28_4_;
  auVar13 = vrcpps_avx(auVar59);
  auVar80._4_4_ = auVar47._4_4_ * fVar28;
  auVar80._0_4_ = auVar47._0_4_ * fVar23;
  auVar80._8_4_ = auVar47._8_4_ * fVar30;
  auVar80._12_4_ = auVar47._12_4_ * fVar32;
  auVar80._16_4_ = auVar47._16_4_ * fVar42;
  auVar80._20_4_ = auVar47._20_4_ * fVar43;
  auVar80._24_4_ = auVar47._24_4_ * fVar44;
  auVar80._28_4_ = fVar66;
  auVar15 = vsubps_avx(auVar15,auVar80);
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = &DAT_3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  fVar66 = auVar13._0_4_;
  fVar33 = auVar13._4_4_;
  auVar16._4_4_ = fVar33 * auVar59._4_4_;
  auVar16._0_4_ = fVar66 * auVar59._0_4_;
  fVar39 = auVar13._8_4_;
  auVar16._8_4_ = fVar39 * auVar59._8_4_;
  fVar40 = auVar13._12_4_;
  auVar16._12_4_ = fVar40 * auVar59._12_4_;
  fVar41 = auVar13._16_4_;
  auVar16._16_4_ = fVar41 * auVar59._16_4_;
  fVar48 = auVar13._20_4_;
  auVar16._20_4_ = fVar48 * auVar59._20_4_;
  fVar49 = auVar13._24_4_;
  auVar16._24_4_ = fVar49 * auVar59._24_4_;
  auVar16._28_4_ = auVar59._28_4_;
  auVar80 = vsubps_avx(auVar65,auVar16);
  auVar17._4_4_ = auVar15._4_4_ * (fVar33 + fVar33 * auVar80._4_4_);
  auVar17._0_4_ = auVar15._0_4_ * (fVar66 + fVar66 * auVar80._0_4_);
  auVar17._8_4_ = auVar15._8_4_ * (fVar39 + fVar39 * auVar80._8_4_);
  auVar17._12_4_ = auVar15._12_4_ * (fVar40 + fVar40 * auVar80._12_4_);
  auVar17._16_4_ = auVar15._16_4_ * (fVar41 + fVar41 * auVar80._16_4_);
  auVar17._20_4_ = auVar15._20_4_ * (fVar48 + fVar48 * auVar80._20_4_);
  auVar17._24_4_ = auVar15._24_4_ * (fVar49 + fVar49 * auVar80._24_4_);
  auVar17._28_4_ = auVar13._28_4_ + auVar80._28_4_;
  auVar13 = vminps_avx(auVar17,auVar65);
  auVar80 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar13,auVar80);
  fVar66 = local_120._0_4_;
  fVar77 = local_120._4_4_;
  fVar78 = local_120._8_4_;
  fVar79 = local_120._12_4_;
  fVar67 = local_120._16_4_;
  fVar69 = local_120._20_4_;
  fVar70 = local_120._24_4_;
  fVar33 = auVar47._0_4_ + fVar66 * fVar23;
  fVar39 = auVar47._4_4_ + fVar77 * fVar28;
  fVar40 = auVar47._8_4_ + fVar78 * fVar30;
  fVar41 = auVar47._12_4_ + fVar79 * fVar32;
  fVar42 = auVar47._16_4_ + fVar67 * fVar42;
  fVar43 = auVar47._20_4_ + fVar69 * fVar43;
  fVar44 = auVar47._24_4_ + fVar70 * fVar44;
  fVar45 = auVar75._0_4_ + fVar66 * fVar45;
  fVar48 = auVar75._4_4_ + fVar77 * fVar27;
  fVar49 = auVar75._8_4_ + fVar78 * fVar29;
  fVar50 = auVar75._12_4_ + fVar79 * fVar31;
  fVar51 = auVar75._16_4_ + fVar67 * fVar51;
  fVar52 = auVar75._20_4_ + fVar69 * fVar52;
  fVar53 = auVar75._24_4_ + fVar70 * fVar53;
  auVar13 = vsubps_avx(auVar25,auVar76);
  local_e0._0_4_ = auVar76._0_4_ + fVar66 * auVar13._0_4_;
  local_e0._4_4_ = auVar76._4_4_ + fVar77 * auVar13._4_4_;
  local_e0._8_4_ = auVar76._8_4_ + fVar78 * auVar13._8_4_;
  local_e0._12_4_ = auVar76._12_4_ + fVar79 * auVar13._12_4_;
  local_e0._16_4_ = auVar76._16_4_ + fVar67 * auVar13._16_4_;
  local_e0._20_4_ = auVar76._20_4_ + fVar69 * auVar13._20_4_;
  local_e0._24_4_ = auVar76._24_4_ + fVar70 * auVar13._24_4_;
  local_e0._28_4_ = auVar76._28_4_ + auVar13._28_4_;
  auVar13 = vsubps_avx(local_180,local_160);
  fVar23 = local_160._0_4_ + fVar66 * auVar13._0_4_;
  fVar27 = local_160._4_4_ + fVar77 * auVar13._4_4_;
  fVar28 = local_160._8_4_ + fVar78 * auVar13._8_4_;
  fVar66 = local_160._12_4_ + fVar79 * auVar13._12_4_;
  fVar29 = local_160._16_4_ + fVar67 * auVar13._16_4_;
  fVar30 = local_160._20_4_ + fVar69 * auVar13._20_4_;
  fVar31 = local_160._24_4_ + fVar70 * auVar13._24_4_;
  fVar32 = local_160._28_4_ + auVar13._28_4_;
  auVar38._0_4_ = fVar33 * fVar33 + fVar45 * fVar45;
  auVar38._4_4_ = fVar39 * fVar39 + fVar48 * fVar48;
  auVar38._8_4_ = fVar40 * fVar40 + fVar49 * fVar49;
  auVar38._12_4_ = fVar41 * fVar41 + fVar50 * fVar50;
  auVar38._16_4_ = fVar42 * fVar42 + fVar51 * fVar51;
  auVar38._20_4_ = fVar43 * fVar43 + fVar52 * fVar52;
  auVar38._24_4_ = fVar44 * fVar44 + fVar53 * fVar53;
  auVar38._28_4_ = auVar47._28_4_ + auVar14._28_4_ + auVar75._28_4_ + auVar47._28_4_;
  auVar13._4_4_ = fVar27 * fVar27;
  auVar13._0_4_ = fVar23 * fVar23;
  auVar13._8_4_ = fVar28 * fVar28;
  auVar13._12_4_ = fVar66 * fVar66;
  auVar13._16_4_ = fVar29 * fVar29;
  auVar13._20_4_ = fVar30 * fVar30;
  auVar13._24_4_ = fVar31 * fVar31;
  auVar13._28_4_ = auVar75._28_4_ + auVar47._28_4_;
  uVar20 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar55._4_4_ = uVar20;
  auVar55._0_4_ = uVar20;
  auVar55._8_4_ = uVar20;
  auVar55._12_4_ = uVar20;
  auVar55._16_4_ = uVar20;
  auVar55._20_4_ = uVar20;
  auVar55._24_4_ = uVar20;
  auVar55._28_4_ = uVar20;
  auVar14 = vcmpps_avx(auVar38,auVar13,2);
  auVar13 = vcmpps_avx(auVar55,local_e0,2);
  fVar45 = ray->tfar;
  auVar56._4_4_ = fVar45;
  auVar56._0_4_ = fVar45;
  auVar56._8_4_ = fVar45;
  auVar56._12_4_ = fVar45;
  auVar56._16_4_ = fVar45;
  auVar56._20_4_ = fVar45;
  auVar56._24_4_ = fVar45;
  auVar56._28_4_ = fVar45;
  auVar15 = vcmpps_avx(local_e0,auVar56,2);
  auVar13 = vandps_avx(auVar15,auVar13);
  fVar45 = pre->depth_scale;
  auVar13 = vandps_avx(auVar13,auVar14);
  auVar14._4_4_ = fVar45 * (fVar27 + fVar27);
  auVar14._0_4_ = fVar45 * (fVar23 + fVar23);
  auVar14._8_4_ = fVar45 * (fVar28 + fVar28);
  auVar14._12_4_ = fVar45 * (fVar66 + fVar66);
  auVar14._16_4_ = fVar45 * (fVar29 + fVar29);
  auVar14._20_4_ = fVar45 * (fVar30 + fVar30);
  auVar14._24_4_ = fVar45 * (fVar31 + fVar31);
  auVar14._28_4_ = fVar32 + fVar32;
  auVar14 = vcmpps_avx(local_e0,auVar14,6);
  auVar13 = vandps_avx(auVar14,auVar13);
  auVar34 = vpslld_avx(auVar13._0_16_,0x1f);
  auVar35 = vpsrad_avx(auVar34,0x1f);
  auVar34 = vpslld_avx(auVar13._16_16_,0x1f);
  auVar34 = vpsrad_avx(auVar34,0x1f);
  auVar26._16_16_ = auVar34;
  auVar26._0_16_ = auVar35;
  auVar13 = auVar26 & ~local_140;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vandnps_avx(local_140,auVar26);
    local_c0 = vsubps_avx(local_1a0,local_260);
    local_a0 = vsubps_avx(local_1c0,local_1e0);
    local_80[0] = vsubps_avx(local_240,local_200);
    auVar14 = vcmpps_avx(auVar80,local_c0,4);
    auVar80 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar15 = vcmpps_avx(auVar80,local_a0,4);
    auVar15 = vorps_avx(auVar14,auVar15);
    auVar14 = vcmpps_avx(auVar80,local_80[0],4);
    auVar14 = vorps_avx(auVar15,auVar14);
    auVar15 = auVar13 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar13 = vandps_avx(auVar14,auVar13);
      local_100 = ZEXT832(0) << 0x20;
      uVar20 = vmovmskps_avx(auVar13);
      uVar22 = CONCAT44((int)((ulong)lVar21 >> 0x20),uVar20);
      local_2e0 = pSVar19;
      local_2d8 = ray;
      local_298 = context;
      do {
        local_290.hit = (RTCHitN *)&local_2d0;
        local_290.valid = &local_2e4;
        uVar12 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        local_2b8 = *(uint *)(local_220 + uVar12 * 4);
        pGVar9 = (pSVar19->geometries).items[local_2b8].ptr;
        if ((pGVar9->mask & ray->mask) == 0) {
LAB_010b5c82:
          uVar22 = uVar22 ^ 1L << (uVar12 & 0x3f);
          bVar18 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_2c4 = *(undefined4 *)(local_120 + uVar12 * 4);
            local_2c0 = *(undefined4 *)(local_100 + uVar12 * 4);
            local_2bc = (line->primIDs).field_0.i[uVar12];
            local_2d0 = *(undefined4 *)(local_c0 + uVar12 * 4);
            local_2cc = *(undefined4 *)(local_a0 + uVar12 * 4);
            local_2c8 = *(undefined4 *)(local_80[0] + uVar12 * 4);
            local_2b4 = context->user->instID[0];
            local_2b0 = context->user->instPrimID[0];
            local_260._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_e0 + uVar12 * 4);
            local_2e4 = -1;
            local_290.geometryUserPtr = pGVar9->userPtr;
            local_290.context = context->user;
            local_290.N = 1;
            local_290.ray = (RTCRayN *)ray;
            if ((pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar9->occlusionFilterN)(&local_290), ray = local_2d8, pSVar19 = local_2e0,
               *local_290.valid == 0)) {
LAB_010b5dd9:
              ray->tfar = (float)local_260._0_4_;
              goto LAB_010b5c82;
            }
            p_Var11 = context->args->filter;
            if (p_Var11 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var11)(&local_290);
                ray = local_2d8;
                pSVar19 = local_2e0;
              }
              if (*local_290.valid == 0) goto LAB_010b5dd9;
            }
          }
          bVar18 = 0;
        }
        if ((bVar18 == 0) || (uVar22 == 0)) {
          return (bool)(bVar18 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }